

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationfastlatin.h
# Opt level: O0

int32_t icu_63::CollationFastLatin::getCharIndex(UChar c)

{
  undefined4 local_c;
  UChar c_local;
  
  if ((ushort)c < 0x180) {
    local_c = (uint)(ushort)c;
  }
  else if (((ushort)c < 0x2000) || (0x203f < (ushort)c)) {
    local_c = 0xffffffff;
  }
  else {
    local_c = (ushort)c - 0x1e80;
  }
  return local_c;
}

Assistant:

static inline int32_t getCharIndex(UChar c) {
        if(c <= LATIN_MAX) {
            return c;
        } else if(PUNCT_START <= c && c < PUNCT_LIMIT) {
            return c - (PUNCT_START - LATIN_LIMIT);
        } else {
            // Not a fast Latin character.
            // Note: U+FFFE & U+FFFF are forbidden in tailorings
            // and thus do not occur in any contractions.
            return -1;
        }
    }